

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::AddDeferParseAttribute(FunctionBody *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076b080;
    *puVar4 = 0;
    pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar5->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076b080;
    *puVar4 = 0;
    pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  TVar1 = pFVar5->attributes;
  if ((FunctionBody *)(pFVar5->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_0076b080:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  pFVar5->attributes = TVar1 | DeferredParse;
  return;
}

Assistant:

void FunctionBody::AddDeferParseAttribute()
    {
        this->SetAttributes((FunctionInfo::Attributes) (this->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
    }